

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

void __thiscall BinHash<IPAsKey>::Clear(BinHash<IPAsKey> *this)

{
  IPAsKey *x;
  IPAsKey *pIVar1;
  uint uVar2;
  IPAsKey **ppIVar3;
  IPAsKey **ppIVar4;
  ulong uVar5;
  
  ppIVar4 = this->hashBin;
  if (ppIVar4 != (IPAsKey **)0x0) {
    uVar2 = this->tableSize;
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        pIVar1 = ppIVar4[uVar5];
        if (pIVar1 != (IPAsKey *)0x0) {
          ppIVar3 = ppIVar4 + uVar5;
          do {
            *ppIVar3 = pIVar1->HashNext;
            (*pIVar1->_vptr_IPAsKey[1])(pIVar1);
            ppIVar4 = this->hashBin;
            ppIVar3 = ppIVar4 + uVar5;
            pIVar1 = *ppIVar3;
          } while (pIVar1 != (IPAsKey *)0x0);
          uVar2 = this->tableSize;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar2);
    }
    operator_delete__(ppIVar4);
    this->hashBin = (IPAsKey **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }